

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numerical_integrator.cpp
# Opt level: O1

void __thiscall
NumericalIntegrator::rungeKuttaGill
          (NumericalIntegrator *this,double current_time,VectorXd *current_state_vec,
          VectorXd *control_input_vec,double integration_length,
          Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *next_state_vec)

{
  double **ppdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  Index size;
  VectorXd *pVVar13;
  undefined8 *puVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  Index othersize;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  VectorXd local_118;
  long local_108;
  double local_f8;
  VectorXd *local_f0;
  VectorXd *local_d8;
  double local_d0;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *local_c8;
  double local_c0;
  VectorXd local_b8;
  double *local_a8;
  long lStack_a0;
  double *local_88;
  long lStack_80;
  double *local_68;
  long lStack_60;
  double *local_48;
  long lStack_40;
  
  local_48 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
  lStack_40 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
  local_c8 = next_state_vec;
  if (lStack_40 < 0 && local_48 != (double *)0x0) {
LAB_00109337:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  local_d0 = current_time;
  NMPCModel::stateFunc
            (&this->model_,current_time,current_state_vec,control_input_vec,
             (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_48);
  lVar17 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (lVar17 < 0) goto LAB_00109318;
  local_f0 = &this->k1_vec_;
  dVar22 = integration_length * 0.5;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)current_state_vec;
  local_108 = lVar17;
  local_f8 = dVar22;
  if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
      m_rows == lVar17) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_118);
    local_68 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
    lStack_60 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
    if (lStack_60 < 0 && local_68 != (double *)0x0) goto LAB_00109337;
    local_c0 = dVar22 + local_d0;
    NMPCModel::stateFunc
              (&this->model_,local_c0,&local_b8,control_input_vec,
               (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_68);
    free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar18 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((long)uVar18 < 0) goto LAB_00109318;
    local_d8 = control_input_vec;
    if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
        m_storage.m_rows == uVar18) {
      uVar4 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      if ((long)uVar4 < 0) goto LAB_00109318;
      if (uVar18 == uVar4) {
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             0;
        pVVar13 = (VectorXd *)
                  local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data;
        if (uVar4 != 0) {
          free((void *)0x0);
          if (uVar4 == 0) {
            local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)0x0;
            pVVar13 = (VectorXd *)
                      local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
          }
          else {
            if (0x1fffffffffffffff < uVar4) goto LAB_00108cf7;
            pVVar13 = (VectorXd *)malloc(uVar4 * 8);
            if (uVar4 != 1 && ((ulong)pVVar13 & 0xf) != 0) goto LAB_0010938a;
            if (pVVar13 == (VectorXd *)0x0) goto LAB_00108cf7;
          }
        }
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pVVar13;
        pdVar5 = (current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 .m_storage.m_data;
        pdVar6 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar7 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar18 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        pVVar13 = (VectorXd *)
                  local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data;
        if (uVar4 != uVar18) {
          local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = uVar4;
          if ((long)uVar18 < 0) goto LAB_001093c0;
          free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          uVar4 = uVar18;
          if (uVar18 == 0) {
            pVVar13 = (VectorXd *)0x0;
          }
          else {
            if (0x1fffffffffffffff < uVar18) {
LAB_00108cf7:
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = std::ios::widen;
              __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pVVar13 = (VectorXd *)malloc(uVar18 * 8);
            if (uVar18 != 1 && ((ulong)pVVar13 & 0xf) != 0) goto LAB_0010938a;
            if (pVVar13 == (VectorXd *)0x0) goto LAB_00108cf7;
          }
        }
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar4;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pVVar13;
        if (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != uVar18) {
          pcVar15 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
LAB_00109422:
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar15);
        }
        dVar23 = dVar22 * 0.41421356237309515;
        dVar24 = integration_length * 0.29289321881345254;
        uVar18 = local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows - (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar17 = 0;
          do {
            pdVar9 = pdVar6 + lVar17;
            dVar10 = pdVar9[1];
            pdVar2 = pdVar5 + lVar17;
            dVar3 = pdVar2[1];
            pdVar8 = pdVar7 + lVar17;
            dVar11 = pdVar8[1];
            ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data)->m_storage).m_data + lVar17;
            *ppdVar1 = (double *)(*pdVar8 * dVar24 + *pdVar9 * dVar23 + *pdVar2);
            ppdVar1[1] = (double *)(dVar11 * dVar24 + dVar10 * dVar23 + dVar3);
            lVar17 = lVar17 + 2;
          } while (lVar17 < (long)uVar18);
        }
        if ((long)uVar18 <
            local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows) {
          do {
            (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data)->m_storage).m_data)[uVar18] =
                 (double *)(pdVar7[uVar18] * dVar24 + pdVar6[uVar18] * dVar23 + pdVar5[uVar18]);
            uVar18 = uVar18 + 1;
          } while (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows != uVar18);
        }
        local_88 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
        lStack_80 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
        if (lStack_80 < 0 && local_88 != (double *)0x0) goto LAB_00109337;
        NMPCModel::stateFunc
                  (&this->model_,local_c0,&local_118,local_d8,
                   (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                   &local_88);
        free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        uVar18 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)uVar18 < 0) goto LAB_00109318;
        if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_rows != uVar18) {
          pcVar15 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_00109458;
        }
        uVar4 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((long)uVar4 < 0) goto LAB_00109318;
        if (uVar18 != uVar4) {
          pcVar15 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_00109458;
        }
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             0;
        pVVar13 = (VectorXd *)
                  local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data;
        if (uVar4 != 0) {
          free((void *)0x0);
          if (uVar4 == 0) {
            local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)0x0;
            pVVar13 = (VectorXd *)
                      local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
          }
          else {
            if (0x1fffffffffffffff < uVar4) goto LAB_00108f8b;
            pVVar13 = (VectorXd *)malloc(uVar4 * 8);
            if (uVar4 != 1 && ((ulong)pVVar13 & 0xf) != 0) goto LAB_0010938a;
            if (pVVar13 == (VectorXd *)0x0) goto LAB_00108f8b;
          }
        }
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pVVar13;
        pdVar5 = (current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 .m_storage.m_data;
        pdVar6 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar7 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar18 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        pVVar13 = (VectorXd *)
                  local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data;
        if (uVar4 != uVar18) {
          local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = uVar4;
          if ((long)uVar18 < 0) {
LAB_001093c0:
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                         );
          }
          free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          uVar4 = uVar18;
          if (uVar18 == 0) {
            pVVar13 = (VectorXd *)0x0;
          }
          else {
            if (0x1fffffffffffffff < uVar18) {
LAB_00108f8b:
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = std::ios::widen;
              __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pVVar13 = (VectorXd *)malloc(uVar18 * 8);
            if (uVar18 != 1 && ((ulong)pVVar13 & 0xf) != 0) {
LAB_0010938a:
              __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                            "void *Eigen::internal::aligned_malloc(std::size_t)");
            }
            if (pVVar13 == (VectorXd *)0x0) goto LAB_00108f8b;
          }
        }
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar4;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pVVar13;
        if (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != uVar18) {
          pcVar15 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_00109422;
        }
        dVar22 = dVar22 * 1.4142135623730951;
        dVar23 = integration_length * 1.7071067811865475;
        uVar18 = local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows - (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar17 = 0;
          do {
            pdVar9 = pdVar5 + lVar17;
            dVar24 = pdVar9[1];
            pdVar2 = pdVar6 + lVar17;
            dVar3 = pdVar2[1];
            pdVar8 = pdVar7 + lVar17;
            dVar10 = pdVar8[1];
            ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data)->m_storage).m_data + lVar17;
            *ppdVar1 = (double *)(*pdVar8 * dVar23 + (*pdVar9 - *pdVar2 * dVar22));
            ppdVar1[1] = (double *)(dVar10 * dVar23 + (dVar24 - dVar3 * dVar22));
            lVar17 = lVar17 + 2;
          } while (lVar17 < (long)uVar18);
        }
        if ((long)uVar18 <
            local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows) {
          do {
            (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data)->m_storage).m_data)[uVar18] =
                 (double *)(pdVar7[uVar18] * dVar23 + (pdVar5[uVar18] - pdVar6[uVar18] * dVar22));
            uVar18 = uVar18 + 1;
          } while (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows != uVar18);
        }
        local_a8 = (this->k4_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
        lStack_a0 = (this->k4_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
        if (lStack_a0 < 0 && local_a8 != (double *)0x0) goto LAB_00109337;
        NMPCModel::stateFunc
                  (&this->model_,local_d0 + integration_length,&local_118,local_d8,
                   (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                   &local_a8);
        free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        uVar18 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)uVar18 < 0) {
LAB_00109318:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if ((this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows != uVar18) goto LAB_00109356;
        uVar4 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((long)uVar4 < 0) goto LAB_00109318;
        if (uVar18 == uVar4) {
          uVar18 = (this->k4_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (uVar4 == uVar18) {
            if ((long)uVar18 < 0) goto LAB_00109318;
            if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows == uVar18) {
              uVar4 = *(ulong *)&(local_c8->
                                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                 ).field_0x8;
              if (uVar4 != uVar18) {
                __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                              "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                             );
              }
              uVar18 = *(ulong *)&local_c8->
                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ;
              uVar20 = uVar4;
              if (((uVar18 & 7) == 0) &&
                 (uVar20 = (ulong)((uint)(uVar18 >> 3) & 1), (long)uVar4 <= (long)uVar20)) {
                uVar20 = uVar4;
              }
              pdVar5 = (current_state_vec->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                       m_data;
              pdVar6 = (this->k1_vec_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              pdVar7 = (this->k2_vec_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              pdVar8 = (this->k3_vec_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              pdVar9 = (this->k4_vec_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              lVar17 = uVar4 - uVar20;
              if (0 < (long)uVar20) {
                uVar21 = 0;
                do {
                  *(double *)(uVar18 + uVar21 * 8) =
                       ((pdVar8[uVar21] * 3.414213562373095 +
                         pdVar7[uVar21] * 0.5857864376269049 + pdVar6[uVar21] + pdVar9[uVar21]) *
                       integration_length) / 6.0 + pdVar5[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar20 != uVar21);
              }
              auVar12 = _DAT_00115d10;
              lVar16 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
              uVar21 = uVar20;
              if (1 < lVar17) {
                do {
                  dVar22 = (pdVar5 + uVar21)[1];
                  auVar25._0_8_ =
                       (pdVar9[uVar21] +
                       pdVar8[uVar21] * 3.414213562373095 +
                       pdVar7[uVar21] * 0.5857864376269049 + pdVar6[uVar21]) * integration_length;
                  auVar25._8_8_ =
                       ((pdVar9 + uVar21)[1] +
                       (pdVar8 + uVar21)[1] * 3.414213562373095 +
                       (pdVar7 + uVar21)[1] * 0.5857864376269049 + (pdVar6 + uVar21)[1]) *
                       integration_length;
                  auVar25 = divpd(auVar25,auVar12);
                  pdVar2 = (double *)(uVar18 + uVar21 * 8);
                  *pdVar2 = auVar25._0_8_ + pdVar5[uVar21];
                  pdVar2[1] = auVar25._8_8_ + dVar22;
                  uVar21 = uVar21 + 2;
                } while ((long)uVar21 < lVar16);
              }
              if (lVar16 < (long)uVar4) {
                lVar16 = lVar17 / 2;
                lVar19 = 0;
                do {
                  *(double *)(uVar18 + lVar16 * 0x10 + uVar20 * 8 + lVar19 * 8) =
                       ((pdVar8[uVar20 + lVar16 * 2 + lVar19] * 3.414213562373095 +
                         pdVar7[uVar20 + lVar16 * 2 + lVar19] * 0.5857864376269049 +
                         pdVar6[uVar20 + lVar16 * 2 + lVar19] + pdVar9[uVar20 + lVar16 * 2 + lVar19]
                        ) * integration_length) / 6.0 + pdVar5[uVar20 + lVar16 * 2 + lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar17 % 2 != lVar19);
              }
              return;
            }
            pcVar15 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const ..." /* TRUNCATED STRING LITERAL */
            ;
          }
          else {
            pcVar15 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
          }
          goto LAB_00109458;
        }
      }
      pcVar15 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
      ;
      goto LAB_00109458;
    }
  }
LAB_00109356:
  pcVar15 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
  ;
LAB_00109458:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar15);
}

Assistant:

void NumericalIntegrator::rungeKuttaGill(const double current_time, const Eigen::VectorXd& current_state_vec, const Eigen::VectorXd& control_input_vec, const double integration_length, Eigen::Ref<Eigen::VectorXd> next_state_vec)
{
    model_.stateFunc(current_time, current_state_vec, control_input_vec, k1_vec_);
    model_.stateFunc(current_time+0.5*integration_length, current_state_vec+0.5*integration_length*k1_vec_, control_input_vec, k2_vec_);
    model_.stateFunc(current_time+0.5*integration_length, current_state_vec+integration_length*0.5*(std::sqrt(2)-1)*k1_vec_+integration_length*(1-(1/std::sqrt(2)))*k2_vec_, control_input_vec, k3_vec_);
    model_.stateFunc(current_time+integration_length, current_state_vec-integration_length*0.5*std::sqrt(2)*k2_vec_+integration_length*(1+(1/std::sqrt(2)))*k3_vec_, control_input_vec, k4_vec_);
    next_state_vec = current_state_vec + integration_length*(k1_vec_+(2-std::sqrt(2))*k2_vec_+(2+std::sqrt(2))*k3_vec_+k4_vec_)/6;
}